

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  ImDrawVert *pIVar1;
  uint uVar2;
  ImDrawVert *pIVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (vert_start_idx < vert_end_idx) {
    fVar5 = gradient_p1.x - gradient_p0.x;
    fVar6 = gradient_p1.y - gradient_p0.y;
    pIVar1 = (draw_list->VtxBuffer).Data;
    pIVar3 = pIVar1 + vert_start_idx;
    uVar4 = col0 >> 8 & 0xff;
    uVar2 = col0 >> 0x10 & 0xff;
    do {
      fVar7 = (((pIVar3->pos).x - gradient_p0.x) * fVar5 + ((pIVar3->pos).y - gradient_p0.y) * fVar6
              ) * (1.0 / (fVar5 * fVar5 + fVar6 * fVar6));
      fVar8 = 1.0;
      if (fVar7 <= 1.0) {
        fVar8 = fVar7;
      }
      fVar8 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8);
      pIVar3->col = (uint)*(byte *)((long)&pIVar3->col + 3) << 0x18 |
                    (int)((float)(int)((col1 & 0xff) - (col0 & 0xff)) * fVar8 + (float)(col0 & 0xff)
                         ) | (int)((float)(int)((col1 >> 8 & 0xff) - uVar4) * fVar8 + (float)uVar4)
                             << 8 |
                    (int)(fVar8 * (float)(int)((col1 >> 0x10 & 0xff) - uVar2) + (float)uVar2) <<
                    0x10;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 < pIVar1 + vert_end_idx);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = ImLerp((int)(col0 >> IM_COL32_R_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_R_SHIFT) & 0xFF, t);
        int g = ImLerp((int)(col0 >> IM_COL32_G_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_G_SHIFT) & 0xFF, t);
        int b = ImLerp((int)(col0 >> IM_COL32_B_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_B_SHIFT) & 0xFF, t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}